

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PolicyOptionalWarningEnabled(cmMakefile *this,string *var)

{
  cmake *pcVar1;
  undefined1 uVar2;
  cmValue val;
  cmValue local_10;
  
  local_10 = GetDefinition(this,var);
  if (local_10.Value == (string *)0x0) {
    pcVar1 = this->GlobalGenerator->CMakeInstance;
    uVar2 = 1;
    if (pcVar1->DebugOutput == false) {
      uVar2 = pcVar1->Trace;
    }
  }
  else {
    uVar2 = cmValue::IsOn(&local_10);
  }
  return (bool)uVar2;
}

Assistant:

bool cmMakefile::PolicyOptionalWarningEnabled(std::string const& var) const
{
  // Check for an explicit CMAKE_POLICY_WARNING_CMP<NNNN> setting.
  if (cmValue val = this->GetDefinition(var)) {
    return val.IsOn();
  }
  // Enable optional policy warnings with --debug-output, --trace,
  // or --trace-expand.
  cmake* cm = this->GetCMakeInstance();
  return cm->GetDebugOutput() || cm->GetTrace();
}